

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# litl_split.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  
  iVar3 = 1;
  do {
    if (argc <= iVar3) {
      pcVar4 = (char *)&__archive_name;
      if ((*__archive_name != '\0') && (pcVar4 = __output_dir, *__output_dir != '\0')) {
        litl_split_archive();
        return 0;
      }
LAB_001011fd:
      __usage((int)argv,(char **)pcVar4);
      exit(-1);
    }
    pcVar4 = argv[iVar3];
    iVar2 = iVar3;
    if (*pcVar4 == '-') {
      if (pcVar4[1] == 'd') {
        cVar1 = pcVar4[2];
        ppcVar5 = &__output_dir;
joined_r0x001011b4:
        if (cVar1 == '\0') {
          iVar2 = iVar3 + 1;
          *ppcVar5 = argv[(long)iVar3 + 1];
          goto LAB_001011c0;
        }
      }
      else if (pcVar4[1] == 'f') {
        cVar1 = pcVar4[2];
        ppcVar5 = &__archive_name;
        goto joined_r0x001011b4;
      }
      pcVar4 = "Unknown option %s\n";
      fprintf(_stderr,"Unknown option %s\n");
      goto LAB_001011fd;
    }
LAB_001011c0:
    iVar3 = iVar2 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {

  // parse the arguments passed to this program
  __parse_args(argc, argv);

  // split the archive
  litl_split_archive(__archive_name, __output_dir);

  return EXIT_SUCCESS;
}